

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O2

void Int8_To_Float32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                    int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  float *dest;
  bool bVar1;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    *(float *)destinationBuffer = (float)(int)*sourceBuffer * 0.0078125;
    sourceBuffer = (void *)((long)sourceBuffer + (long)sourceStride);
    destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
  }
  return;
}

Assistant:

static void Int8_To_Float32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    signed char *src = (signed char*)sourceBuffer;
    float *dest =  (float*)destinationBuffer;
    (void)ditherGenerator; /* unused parameter */

    while( count-- )
    {
        float samp = *src * const_1_div_128_;
        *dest = samp;

        src += sourceStride;
        dest += destinationStride;
    }
}